

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.hpp
# Opt level: O0

void __thiscall OpenMD::AtomType::addZig(AtomType *this,AtomType *at)

{
  value_type *in_RDI;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addZig(AtomType* at) { everyZIG.push_back(at); }